

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_filter_count.c
# Opt level: O0

void write_test(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *_a;
  int r;
  archive *a;
  char buff [4096];
  
  _a = archive_write_new();
  iVar1 = archive_write_set_format_ustar(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_filter_count.c"
                      ,L';',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",_a);
  iVar1 = archive_write_set_bytes_per_block(_a,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_filter_count.c"
                      ,L'<',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_bytes_per_block(a, 10)",_a
                     );
  iVar1 = archive_write_add_filter_bzip2(_a);
  if (((iVar1 != -0x14) || (wVar2 = canBzip2(), wVar2 != L'\0')) && (-0x15 < iVar1)) {
    iVar1 = archive_write_open_memory(_a,&a,0x1000,(size_t *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_filter_count.c"
                        ,L'C',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_open_memory(a, buff, 4096, 0)",_a);
    iVar1 = archive_filter_count(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_filter_count.c"
                        ,L'E',2,"2",(long)iVar1,"archive_filter_count(a)",(void *)0x0);
    archive_write_free(_a);
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_filter_count.c"
                 ,L'@');
  test_skipping("bzip2 unsupported");
  return;
}

Assistant:

static void
write_test(void)
{
	char buff[4096];
	struct archive* a = archive_write_new();
	int r;

	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_per_block(a, 10));

	r = archive_write_add_filter_bzip2(a);
	if((ARCHIVE_WARN == r && !canBzip2()) || ARCHIVE_WARN > r) {
		skipping("bzip2 unsupported");
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, 4096, 0));
	/* bzip2 and none */
	assertEqualInt(2, archive_filter_count(a));
	archive_write_free(a);
}